

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::Iface>::dispose
          (Own<kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::Iface> *this)

{
  Dispose_<kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::Iface,_true> *this_00;
  Disposer *in_RDX;
  
  this_00 = (Dispose_<kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::Iface,_true> *)
            this->ptr;
  if (this_00 !=
      (Dispose_<kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::Iface,_true> *)0x0) {
    this->ptr = (Iface *)0x0;
    Disposer::Dispose_<kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>::Iface,_true>::
    dispose(this_00,(Iface *)this->disposer,in_RDX);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }